

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O3

void y4m_convert_411_420jpeg(y4m_input *_y4m,uchar *_dst,uchar *_aux)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  int _c_h;
  ulong uVar4;
  int iVar5;
  uchar uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int _c_w;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uchar *_src;
  int iVar17;
  uint uVar18;
  uchar *local_78;
  
  iVar3 = _y4m->pic_w;
  _c_h = _y4m->pic_h;
  local_78 = _dst + _c_h * iVar3;
  uVar4 = (long)(iVar3 + _y4m->src_c_dec_h + -1) / (long)_y4m->src_c_dec_h;
  _c_w = (iVar3 + _y4m->dst_c_dec_h + -1) / _y4m->dst_c_dec_h;
  iVar3 = _y4m->dst_c_dec_v;
  iVar16 = (int)uVar4;
  _src = _aux + _c_h * iVar16 * 2;
  lVar1 = (long)iVar16 + -1;
  iVar17 = (int)lVar1;
  iVar9 = 1;
  if (iVar17 < 1) {
    iVar9 = iVar17;
  }
  iVar13 = 1;
  iVar10 = 2;
  if (iVar17 < 2) {
    iVar10 = iVar17;
  }
  uVar18 = iVar16 - 2;
  do {
    if (0 < _c_h) {
      iVar5 = 0;
      do {
        uVar11 = 0;
        if (0 < iVar16) {
          iVar7 = (int)((((uint)*_aux * 0x6f + ((uint)_aux[iVar9] + (uint)_aux[iVar9] * 8) * 2) -
                        (uint)_aux[iVar10]) + 0x40) >> 7;
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          uVar6 = (uchar)iVar7;
          if (iVar7 < 1) {
            uVar6 = '\0';
          }
          *_src = uVar6;
          iVar7 = (int)((((uint)_aux[iVar9] * 0x56 + (uint)*_aux * 0x2f) -
                        ((uint)_aux[iVar10] + (uint)_aux[iVar10] * 4)) + 0x40) >> 7;
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          uVar6 = (uchar)iVar7;
          if (iVar7 < 1) {
            uVar6 = '\0';
          }
          _src[1] = uVar6;
          uVar11 = 1;
        }
        if ((int)uVar11 < (int)uVar18) {
          uVar8 = (ulong)uVar11;
          iVar7 = uVar11 * 2 + 1;
          lVar12 = uVar8 << 0x21;
          do {
            iVar14 = (int)((((uint)_aux[uVar8] * 0x6e + (uint)_aux[uVar8 - 1] +
                            ((uint)_aux[uVar8 + 1] + (uint)_aux[uVar8 + 1] * 8) * 2) -
                           (uint)_aux[uVar8 + 2]) + 0x40) >> 7;
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            if (iVar14 < 1) {
              iVar14 = 0;
            }
            _src[lVar12 >> 0x20] = (uchar)iVar14;
            iVar14 = (int)((((uint)_aux[uVar8 + 1] * 0x56 +
                            ((uint)_aux[uVar8] * 0x32 -
                            ((uint)_aux[uVar8 - 1] + (uint)_aux[uVar8 - 1] * 2))) -
                           ((uint)_aux[uVar8 + 2] + (uint)_aux[uVar8 + 2] * 4)) + 0x40) >> 7;
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            if (iVar14 < 1) {
              iVar14 = 0;
            }
            uVar8 = uVar8 + 1;
            _src[iVar7] = (uchar)iVar14;
            iVar7 = iVar7 + 2;
            lVar12 = lVar12 + 0x200000000;
            uVar11 = uVar18;
          } while (uVar18 != uVar8);
        }
        if ((int)uVar11 < iVar16) {
          iVar7 = uVar11 * 2 + 1;
          lVar12 = (ulong)uVar11 << 0x21;
          uVar8 = (ulong)uVar11;
          do {
            uVar2 = uVar8 + 1;
            iVar14 = iVar17;
            if ((int)uVar2 < iVar17) {
              iVar14 = (int)uVar2;
            }
            iVar15 = (int)((((uint)_aux[uVar8] * 0x6e + (uint)_aux[uVar8 - 1] +
                            ((uint)_aux[iVar14] + (uint)_aux[iVar14] * 8) * 2) - (uint)_aux[lVar1])
                          + 0x40) >> 7;
            if (0xfe < iVar15) {
              iVar15 = 0xff;
            }
            if (iVar15 < 1) {
              iVar15 = 0;
            }
            _src[lVar12 >> 0x20] = (uchar)iVar15;
            if (iVar7 < _c_w) {
              iVar14 = (int)((((uint)_aux[iVar14] * 0x56 +
                              ((uint)_aux[uVar8] * 0x32 -
                              ((uint)_aux[uVar8 - 1] + (uint)_aux[uVar8 - 1] * 2))) -
                             ((uint)_aux[lVar1] + (uint)_aux[lVar1] * 4)) + 0x40) >> 7;
              if (0xfe < iVar14) {
                iVar14 = 0xff;
              }
              if (iVar14 < 1) {
                iVar14 = 0;
              }
              _src[iVar7] = (uchar)iVar14;
            }
            iVar7 = iVar7 + 2;
            lVar12 = lVar12 + 0x200000000;
            uVar8 = uVar2;
          } while ((uVar4 & 0xffffffff) != uVar2);
        }
        _src = _src + _c_w;
        _aux = _aux + iVar16;
        iVar5 = iVar5 + 1;
      } while (iVar5 != _c_h);
    }
    _src = _src + -(long)(_c_w * _c_h);
    y4m_422jpeg_420jpeg_helper(local_78,_src,_c_w,_c_h);
    local_78 = local_78 + ((_c_h + iVar3 + -1) / iVar3) * _c_w;
    iVar13 = iVar13 + 1;
  } while (iVar13 != 3);
  return;
}

Assistant:

static void y4m_convert_411_420jpeg(y4m_input *_y4m, unsigned char *_dst,
                                    unsigned char *_aux) {
  unsigned char *tmp;
  int c_w;
  int c_h;
  int c_sz;
  int dst_c_w;
  int dst_c_h;
  int dst_c_sz;
  int tmp_sz;
  int pli;
  int y;
  int x;
  /*Skip past the luma data.*/
  _dst += _y4m->pic_w * _y4m->pic_h;
  /*Compute the size of each chroma plane.*/
  c_w = (_y4m->pic_w + _y4m->src_c_dec_h - 1) / _y4m->src_c_dec_h;
  c_h = _y4m->pic_h;
  dst_c_w = (_y4m->pic_w + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h;
  dst_c_h = (_y4m->pic_h + _y4m->dst_c_dec_v - 1) / _y4m->dst_c_dec_v;
  c_sz = c_w * c_h;
  dst_c_sz = dst_c_w * dst_c_h;
  tmp_sz = dst_c_w * c_h;
  tmp = _aux + 2 * c_sz;
  for (pli = 1; pli < 3; pli++) {
    /*In reality, the horizontal and vertical steps could be pipelined, for
       less memory consumption and better cache performance, but we do them
       separately for simplicity.*/
    /*First do horizontal filtering (convert to 422jpeg)*/
    for (y = 0; y < c_h; y++) {
      /*Filters: [1 110 18 -1]/128 and [-3 50 86 -5]/128, both derived from a
         4-tap Mitchell window.*/
      for (x = 0; x < OC_MINI(c_w, 1); x++) {
        tmp[x << 1] = (unsigned char)OC_CLAMPI(
            0,
            (111 * _aux[0] + 18 * _aux[OC_MINI(1, c_w - 1)] -
             _aux[OC_MINI(2, c_w - 1)] + 64) >>
                7,
            255);
        tmp[x << 1 | 1] = (unsigned char)OC_CLAMPI(
            0,
            (47 * _aux[0] + 86 * _aux[OC_MINI(1, c_w - 1)] -
             5 * _aux[OC_MINI(2, c_w - 1)] + 64) >>
                7,
            255);
      }
      for (; x < c_w - 2; x++) {
        tmp[x << 1] =
            (unsigned char)OC_CLAMPI(0,
                                     (_aux[x - 1] + 110 * _aux[x] +
                                      18 * _aux[x + 1] - _aux[x + 2] + 64) >>
                                         7,
                                     255);
        tmp[x << 1 | 1] = (unsigned char)OC_CLAMPI(
            0,
            (-3 * _aux[x - 1] + 50 * _aux[x] + 86 * _aux[x + 1] -
             5 * _aux[x + 2] + 64) >>
                7,
            255);
      }
      for (; x < c_w; x++) {
        tmp[x << 1] = (unsigned char)OC_CLAMPI(
            0,
            (_aux[x - 1] + 110 * _aux[x] + 18 * _aux[OC_MINI(x + 1, c_w - 1)] -
             _aux[c_w - 1] + 64) >>
                7,
            255);
        if ((x << 1 | 1) < dst_c_w) {
          tmp[x << 1 | 1] = (unsigned char)OC_CLAMPI(
              0,
              (-3 * _aux[x - 1] + 50 * _aux[x] +
               86 * _aux[OC_MINI(x + 1, c_w - 1)] - 5 * _aux[c_w - 1] + 64) >>
                  7,
              255);
        }
      }
      tmp += dst_c_w;
      _aux += c_w;
    }
    tmp -= tmp_sz;
    /*Now do the vertical filtering.*/
    y4m_422jpeg_420jpeg_helper(_dst, tmp, dst_c_w, c_h);
    _dst += dst_c_sz;
  }
}